

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

void __thiscall
vkt::ssbo::SSBOLayoutCase::SSBOLayoutCase
          (SSBOLayoutCase *this,TestContext *testCtx,char *name,char *description,
          BufferMode bufferMode,MatrixLoadFlags matrixLoadFlag)

{
  char *__s;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  MatrixLoadFlags local_30;
  BufferMode local_2c;
  MatrixLoadFlags matrixLoadFlag_local;
  BufferMode bufferMode_local;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  SSBOLayoutCase *this_local;
  
  local_30 = matrixLoadFlag;
  local_2c = bufferMode;
  _matrixLoadFlag_local = description;
  description_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  __s = _matrixLoadFlag_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_01669528;
  this->m_bufferMode = local_2c;
  ShaderInterface::ShaderInterface(&this->m_interface);
  this->m_matrixLoadFlag = local_30;
  BufferLayout::BufferLayout(&this->m_refLayout);
  RefDataStorage::RefDataStorage(&this->m_initialData);
  RefDataStorage::RefDataStorage(&this->m_writeData);
  std::__cxx11::string::string((string *)&this->m_computeShaderSrc);
  return;
}

Assistant:

SSBOLayoutCase::SSBOLayoutCase (tcu::TestContext& testCtx, const char* name, const char* description, BufferMode bufferMode, MatrixLoadFlags matrixLoadFlag)
	: TestCase			(testCtx, name, description)
	, m_bufferMode		(bufferMode)
	, m_matrixLoadFlag	(matrixLoadFlag)
{
}